

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priminfo_mb.h
# Opt level: O1

SetMB * __thiscall
embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>
          (SetMB *__return_storage_ptr__,SetMB *this,VirtualRecalculatePrimRef *recalculatePrimRef,
          LinearSpace3fa *space)

{
  float fVar1;
  BBox1f BVar2;
  BBox1f BVar3;
  PrimRefMB *pPVar4;
  Geometry *pGVar5;
  PrimRefVector pmVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  unsigned_long uVar9;
  undefined1 auVar10 [16];
  char cVar11;
  float fVar12;
  runtime_error *this_00;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  PrimInfoMB pinfo;
  anon_class_24_3_3f686411 computePrimInfo;
  task_group_context context;
  undefined4 in_stack_fffffffffffffd18;
  float fVar28;
  undefined4 in_stack_fffffffffffffd1c;
  float fVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2c8;
  undefined1 local_2b8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2a8;
  undefined1 local_298 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_288;
  undefined1 local_278 [16];
  unsigned_long local_268;
  unsigned_long uStack_260;
  size_t local_258;
  size_t sStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  BBox1f local_230;
  BBox1f local_228;
  SetMB *local_220;
  size_t local_218;
  ulong local_210;
  SetMB *local_208;
  VirtualRecalculatePrimRef *local_200;
  LinearSpace3fa *local_1f8;
  BBox1f local_1f0;
  BBox1f local_1e8;
  undefined8 local_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  BBox1f local_1c8;
  undefined8 uStack_1c0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b8;
  undefined1 local_1a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_168;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined1 local_128 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined1 *local_d4;
  undefined4 local_cc;
  task_group_context local_c8;
  code *local_40 [2];
  
  BVar2 = (BBox1f)(this->super_PrimInfoMB).object_range._begin;
  BVar3 = (BBox1f)(this->super_PrimInfoMB).object_range._end;
  local_158.m128 = _DAT_01feb9f0;
  local_148 = _DAT_01feba00;
  local_138.m128 = _DAT_01feb9f0;
  local_128 = _DAT_01feba00;
  local_118.m128 = _DAT_01feb9f0;
  local_108 = _DAT_01feba00;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  local_d4 = &DAT_3f8000003f800000;
  local_cc = 0;
  local_210 = (long)BVar3 - (long)BVar2;
  local_208 = this;
  local_200 = recalculatePrimRef;
  local_1f8 = space;
  if (local_210 < 0xc00) {
    local_2c8.m128 = _DAT_01feb9f0;
    local_2b8 = _DAT_01feba00;
    local_2a8.m128 = _DAT_01feb9f0;
    local_298 = _DAT_01feba00;
    local_288.m128 = _DAT_01feb9f0;
    local_278 = _DAT_01feba00;
    local_258 = 0;
    sStack_250 = 0;
    local_248 = 0.0;
    local_268 = 0;
    uStack_260 = 0;
    fStack_244 = 1.0;
    fStack_240 = 1.0;
    fStack_23c = 0.0;
    local_218 = 0;
    sVar15 = 0;
    if ((ulong)BVar2 < (ulong)BVar3) {
      lVar14 = (long)BVar2 * 0x50 + 0x1c;
      fVar18 = 0.0;
      fVar21 = 1.0;
      local_168 = _DAT_01feb9f0;
      local_178 = _DAT_01feba00;
      local_188 = _DAT_01feba00;
      local_198 = _DAT_01feb9f0;
      local_1a8 = _DAT_01feba00;
      local_1b8 = _DAT_01feb9f0;
      fVar20 = 1.0;
      fVar23 = 0.0;
      local_230 = BVar3;
      local_228 = BVar2;
      local_220 = __return_storage_ptr__;
      do {
        pPVar4 = this->prims->items;
        local_1f0 = (this->super_PrimInfoMB).time_range;
        fVar29 = *(float *)((long)pPVar4 + lVar14 + -0x10);
        fVar1 = *(float *)((long)&(pPVar4->lbounds).bounds0.lower.field_0 + lVar14);
        pGVar5 = (local_200->scene->geometries).items[(uint)fVar29].ptr;
        (*(pGVar5->super_RefCount)._vptr_RefCount[0x3e])
                  (&local_c8,pGVar5,local_1f8,(ulong)(uint)fVar1,&local_1f0);
        local_1c8 = pGVar5->time_range;
        fVar28 = pGVar5->fnumTimeSegments;
        fVar12 = local_1c8.lower;
        local_1d8 = local_1c8.upper;
        fVar22 = local_1d8 - fVar12;
        uStack_1c0 = 0;
        fVar26 = local_1f0.upper - fVar12;
        fStack_1d4 = local_1d8;
        fStack_1d0 = local_1d8;
        fStack_1cc = local_1d8;
        fVar19 = floorf(((local_1f0.lower - fVar12) / fVar22) * 1.0000002 * fVar28);
        fVar12 = 0.0;
        if (0.0 <= fVar19) {
          fVar12 = fVar19;
        }
        fVar19 = ceilf((fVar26 / fVar22) * 0.99999976 * fVar28);
        if (fVar28 <= fVar19) {
          fVar19 = fVar28;
        }
        fVar12 = (float)((int)fVar19 - (int)fVar12);
        fVar19 = (float)(pGVar5->numTimeSteps - 1);
        uVar13 = (ulong)(uint)fVar19;
        auVar10._8_8_ = local_c8.my_node.my_next_node;
        auVar10._0_8_ = local_c8.my_node.my_prev_node;
        auVar25._12_4_ = fVar29;
        auVar25._0_8_ = local_c8.my_cpu_ctl_env;
        auVar25._8_4_ = local_c8.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i;
        auVar24._0_12_ = local_c8._16_12_;
        auVar24._12_4_ = fVar1;
        auVar27._0_4_ =
             local_c8.field_6._0_4_ * 0.5 + local_c8.my_exception._M_b._M_p._0_4_ * 0.5 +
             (float)local_c8.my_cpu_ctl_env * 0.5 + SUB84(local_c8.my_node.my_prev_node,0) * 0.5;
        auVar27._4_4_ =
             local_c8.field_6._4_4_ * 0.5 + local_c8.my_exception._M_b._M_p._4_4_ * 0.5 +
             local_c8.my_cpu_ctl_env._4_4_ * 0.5 +
             (float)((ulong)local_c8.my_node.my_prev_node >> 0x20) * 0.5;
        auVar27._8_4_ =
             local_c8.my_context_list._0_4_ * 0.5 + local_c8.my_itt_caller._0_4_ * 0.5 +
             local_c8.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i * 0.5 +
             SUB84(local_c8.my_node.my_next_node,0) * 0.5;
        auVar27._12_4_ = fVar1 * 0.5 + fVar19 * 0.5 + fVar29 * 0.5 + fVar12 * 0.5;
        local_218 = (uint)fVar12 + local_218;
        fVar28 = local_1d8;
        fVar29 = local_1c8.lower;
        if (uVar13 <= sVar15) {
          fVar28 = fVar20;
          fVar29 = fVar23;
        }
        local_198.m128 = (__m128)minps(local_198.m128,auVar25);
        local_188 = maxps(local_188,auVar24);
        auVar8._12_4_ = fVar12;
        auVar8._0_12_ = auVar10._0_12_;
        local_1b8.m128 = (__m128)minps(local_1b8.m128,auVar8);
        auVar7._12_4_ = fVar19;
        auVar7._0_12_ = local_c8._48_12_;
        local_1a8 = maxps(local_1a8,auVar7);
        local_168.m128 = (__m128)minps(local_168.m128,auVar27);
        local_178 = maxps(local_178,auVar27);
        if (local_1c8.lower <= fVar21) {
          fVar21 = local_1c8.lower;
        }
        if (sVar15 <= uVar13) {
          sVar15 = uVar13;
        }
        fVar20 = local_1d8;
        if (local_1d8 <= fVar18) {
          fVar20 = fVar18;
        }
        fVar18 = fVar20;
        lVar14 = lVar14 + 0x50;
        local_210 = local_210 - 1;
        fVar20 = fVar28;
        fVar23 = fVar29;
      } while (local_210 != 0);
      uStack_260 = (long)local_230 - (long)local_228;
      __return_storage_ptr__ = local_220;
      local_2c8 = local_198;
      local_2b8 = local_188;
      local_2a8 = local_1b8;
      local_298 = local_1a8;
      local_288 = local_168;
      local_278 = local_178;
      local_258 = local_218;
      sStack_250 = sVar15;
      local_248 = fVar29;
      fStack_244 = fVar28;
      fStack_240 = fVar21;
      fStack_23c = fVar18;
    }
    else {
      fStack_23c = 0.0;
      fStack_244 = 1.0;
      fStack_240 = 1.0;
      local_258 = local_218;
      sStack_250 = sVar15;
      local_248 = 0.0;
    }
  }
  else {
    local_c8.my_version = proxy_support;
    local_c8.my_traits = (context_traits)0x4;
    local_c8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_c8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_c8.my_name = CUSTOM_CTX;
    tbb::detail::r1::initialize(&local_c8);
    local_1e0 = 0x400;
    local_40[0] = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
    local_40[1] = (code *)&local_208;
    local_1f0 = BVar3;
    local_1e8 = BVar2;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>(embree::sse2::VirtualRecalculatePrimRef_const&,embree::LinearSpace3<embree::Vec3fa>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::SetMB::primInfo<embree::sse2::VirtualRecalculatePrimRef>(embree::sse2::VirtualRecalculatePrimRef_const&,embree::LinearSpace3<embree::Vec3fa>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
              ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_2c8.field_1,(d1 *)&local_1f0,
               (blocked_range<unsigned_long> *)&local_158.field_1,
               (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_40,
               (anon_class_16_2_ed117de8_conflict17 *)
               PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
               (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                *)&local_c8,
               (task_group_context *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    cVar11 = tbb::detail::r1::is_group_execution_cancelled(&local_c8);
    if (cVar11 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_c8);
  }
  pmVar6 = this->prims;
  BVar2 = (this->super_PrimInfoMB).time_range;
  fVar21 = BVar2.lower;
  fVar20 = BVar2.upper;
  *(undefined8 *)
   &(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
    geomBounds.bounds0.lower.field_0 = local_2c8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>
           .geomBounds.bounds0.lower.field_0 + 8) = local_2c8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
    geomBounds.bounds0.upper.field_0 = local_2b8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>
           .geomBounds.bounds0.upper.field_0 + 8) = local_2b8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
    geomBounds.bounds1.lower.field_0 = local_2a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>
           .geomBounds.bounds1.lower.field_0 + 8) = local_2a8._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
    geomBounds.bounds1.upper.field_0 = local_298._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>
           .geomBounds.bounds1.upper.field_0 + 8) = local_298._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
    centBounds.lower.field_0 = local_288._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>
           .centBounds.lower.field_0 + 8) = local_288._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
    centBounds.upper.field_0 = local_278._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>
           .centBounds.upper.field_0 + 8) = local_278._8_8_;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._begin = local_268;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._end = uStack_260;
  BVar2.upper = fStack_244;
  BVar2.lower = local_248;
  BVar3.upper = fStack_23c;
  BVar3.lower = fStack_240;
  (__return_storage_ptr__->super_PrimInfoMB).num_time_segments = local_258;
  (__return_storage_ptr__->super_PrimInfoMB).max_num_time_segments = sStack_250;
  (__return_storage_ptr__->super_PrimInfoMB).max_time_range = BVar2;
  (__return_storage_ptr__->super_PrimInfoMB).time_range = BVar3;
  __return_storage_ptr__->prims = pmVar6;
  uVar9 = (this->super_PrimInfoMB).object_range._end;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._begin =
       (this->super_PrimInfoMB).object_range._begin;
  (__return_storage_ptr__->super_PrimInfoMB).object_range._end = uVar9;
  BVar2 = (__return_storage_ptr__->super_PrimInfoMB).time_range;
  fVar23 = BVar2.lower;
  fVar18 = BVar2.upper;
  uVar16 = -(uint)(fVar23 < fVar21);
  uVar17 = -(uint)(fVar18 < fVar20);
  (__return_storage_ptr__->super_PrimInfoMB).time_range =
       (BBox1f)(CONCAT44(~uVar17 & (uint)fVar20,~uVar16 & (uint)fVar23) |
               CONCAT44((uint)fVar18 & uVar17,(uint)fVar21 & uVar16));
  return __return_storage_ptr__;
}

Assistant:

const SetMB primInfo(const RecalculatePrimRef& recalculatePrimRef, const LinearSpace3fa& space) const
      {
        auto computePrimInfo = [&](const range<size_t>& r) -> PrimInfoMB
        {
          PrimInfoMB pinfo(empty);
          for (size_t j=r.begin(); j<r.end(); j++)
          {
            PrimRefMB& ref = (*prims)[j];
            PrimRefMB ref1 = recalculatePrimRef(ref,time_range,space);
            pinfo.add_primref(ref1);
          };
          return pinfo;
        };
        
        const PrimInfoMB pinfo = parallel_reduce(object_range.begin(), object_range.end(), PARALLEL_FIND_BLOCK_SIZE, PARALLEL_THRESHOLD, 
                                                 PrimInfoMB(empty), computePrimInfo, PrimInfoMB::merge2);

        return SetMB(pinfo,prims,object_range,time_range);
      }